

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

void combine_pack(player *p)

{
  ushort uVar1;
  object_stack_t mode2;
  object_stack_t mode;
  _Bool _Var2;
  _Bool _Var3;
  bool bVar4;
  wchar_t wVar5;
  object *poVar6;
  uint16_t uVar7;
  object **ppoVar8;
  object *obj;
  object *obj_00;
  int local_40;
  wchar_t n_free_slot;
  object **local_38;
  
  poVar6 = gear_last_item(p);
  local_38 = &p->gear;
  bVar4 = false;
LAB_0018decf:
  do {
    obj = poVar6;
    if (obj == (object *)0x0) {
      calc_inventory(p);
      event_signal(EVENT_INVENTORY);
      event_signal(EVENT_EQUIPMENT);
      if ((bVar4) && (msg("You combine some items in your pack."), bVar4)) {
        cmd_disable_repeat();
        return;
      }
      return;
    }
    if (obj->kind == (object_kind *)0x0) {
      __assert_fail("obj1->kind",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                    ,0x4f9,"void combine_pack(struct player *)");
    }
    _Var2 = tval_is_money(obj);
    if (_Var2) {
      __assert_fail("!tval_is_money(obj1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                    ,0x4fa,"void combine_pack(struct player *)");
    }
    poVar6 = obj->prev;
    ppoVar8 = local_38;
    while( true ) {
      obj_00 = *ppoVar8;
      if ((obj_00 == (object *)0x0) || (obj_00 == obj)) goto LAB_0018decf;
      _Var2 = object_is_in_quiver(p,obj_00);
      mode = OSTACK_PACK;
      if (_Var2) {
        mode = OSTACK_QUIVER;
      }
      if (obj_00->kind == (object_kind *)0x0) {
        __assert_fail("obj2->kind",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                      ,0x503,"void combine_pack(struct player *)");
      }
      _Var3 = object_mergeable(obj_00,obj,mode);
      if (_Var3) break;
      _Var3 = object_is_in_quiver(p,obj);
      mode2 = OSTACK_PACK;
      if (_Var3) {
        mode2 = OSTACK_QUIVER;
      }
      _Var3 = object_stackable(obj_00,obj,mode2 | mode);
      if (_Var3) {
        if (_Var2) {
          uVar1 = z_info->quiver_slot_size;
          _Var2 = tval_is_ammo(obj_00);
          uVar7 = 1;
          if (!_Var2) {
            uVar7 = z_info->thrown_quiver_mult;
          }
          if (uVar1 / uVar7 != (ushort)obj_00->number) {
            if ((mode2 & OSTACK_PACK) != OSTACK_NONE) {
              uVar1 = z_info->pack_size;
              wVar5 = pack_slots_used(p);
              n_free_slot = (uint)uVar1 - wVar5;
              quiver_absorb_num(p,obj,&n_free_slot,&local_40);
              if (local_40 < 1) goto LAB_0018e031;
            }
LAB_0018e065:
            object_absorb_partial(obj_00->known,obj->known,mode,mode2);
            object_absorb_partial(obj_00,obj,mode,mode2);
            obj_00->known->number = obj_00->number;
            obj_00 = obj;
            goto LAB_0018e09c;
          }
        }
        else if (obj_00->kind->base->max_stack != (uint)obj_00->number) goto LAB_0018e065;
      }
LAB_0018e031:
      ppoVar8 = &obj_00->next;
    }
    object_absorb(obj_00->known,obj->known);
    obj->known = (object *)0x0;
    object_absorb(obj_00,obj);
    bVar4 = true;
LAB_0018e09c:
    obj_00->known->number = obj_00->number;
  } while( true );
}

Assistant:

void combine_pack(struct player *p)
{
	struct object *obj1, *obj2, *prev;
	bool display_message = false;
	bool disable_repeat = false;

	/* Combine the pack (backwards) */
	obj1 = gear_last_item(p);
	while (obj1) {
		assert(obj1->kind);
		assert(!tval_is_money(obj1));
		prev = obj1->prev;

		/* Scan the items above that item */
		for (obj2 = p->gear; obj2 && obj2 != obj1; obj2 = obj2->next) {
			object_stack_t stack_mode2 =
				object_is_in_quiver(p, obj2) ?
				OSTACK_QUIVER : OSTACK_PACK;

			assert(obj2->kind);

			/* Can we drop "obj1" onto "obj2"? */
			if (object_mergeable(obj2, obj1, stack_mode2)) {
				display_message = true;
				disable_repeat = true;
				object_absorb(obj2->known, obj1->known);
				obj1->known = NULL;
				object_absorb(obj2, obj1);

				/* Ensure numbers align (should not be necessary, but safer) */
				obj2->known->number = obj2->number;

				break;
			} else {
				object_stack_t stack_mode1 =
					object_is_in_quiver(p, obj1) ?
					OSTACK_QUIVER : OSTACK_PACK;

				if (inven_can_stack_partial(p, obj2, obj1,
						stack_mode2, stack_mode1)) {
					/*
					 * Don't display a message for this
					 * case:  shuffling items between
					 * stacks isn't interesting to the
					 * player.
					 */
					object_absorb_partial(obj2->known,
						obj1->known, stack_mode2,
						stack_mode1);
					object_absorb_partial(obj2, obj1,
						stack_mode2, stack_mode1);
					/*
					 * Ensure numbers align (should not be
					 * necessary, but safer)
					 */
					obj2->known->number = obj2->number;
					obj1->known->number = obj1->number;

					break;
				}
			}
		}
		obj1 = prev;
	}

	calc_inventory(p);

	/* Redraw gear */
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);

	/* Message */
	if (display_message) {
		msg("You combine some items in your pack.");

		/*
		 * Stop "repeat last command" from working if a stack was
		 * completely combined with another.
		 */
		if (disable_repeat) cmd_disable_repeat();
	}
}